

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_misc.h
# Opt level: O3

int mbedtls_ssl_sig_alg_is_offered(mbedtls_ssl_context *ssl,uint16_t proposed_sig_alg)

{
  uint16_t uVar1;
  mbedtls_ssl_handshake_params *pmVar2;
  uint16_t *puVar3;
  
  pmVar2 = ssl->handshake;
  if ((((pmVar2 != (mbedtls_ssl_handshake_params *)0x0) &&
       (pmVar2->sig_algs_heap_allocated == '\x01')) &&
      (puVar3 = pmVar2->sig_algs, puVar3 != (uint16_t *)0x0)) ||
     (puVar3 = ssl->conf->sig_algs, puVar3 != (uint16_t *)0x0)) {
    uVar1 = *puVar3;
    while (uVar1 != 0) {
      puVar3 = puVar3 + 1;
      if (uVar1 == proposed_sig_alg) {
        return 1;
      }
      uVar1 = *puVar3;
    }
  }
  return 0;
}

Assistant:

static inline int mbedtls_ssl_sig_alg_is_offered(const mbedtls_ssl_context *ssl,
                                                 uint16_t proposed_sig_alg)
{
    const uint16_t *sig_alg = mbedtls_ssl_get_sig_algs(ssl);
    if (sig_alg == NULL) {
        return 0;
    }

    for (; *sig_alg != MBEDTLS_TLS_SIG_NONE; sig_alg++) {
        if (*sig_alg == proposed_sig_alg) {
            return 1;
        }
    }
    return 0;
}